

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O0

bool __thiscall
frozen::boyer_moore_searcher<1UL>::is_prefix
          (boyer_moore_searcher<1UL> *this,char (*needle) [2],size_t pos)

{
  ulong local_38;
  size_t i;
  size_t suffixlen;
  size_t pos_local;
  char (*needle_local) [2];
  boyer_moore_searcher<1UL> *this_local;
  
  local_38 = 0;
  while( true ) {
    if (1 - pos <= local_38) {
      return true;
    }
    if ((*needle)[local_38] != (*needle)[pos + local_38]) break;
    local_38 = local_38 + 1;
  }
  return false;
}

Assistant:

constexpr bool is_prefix(char const (&needle)[size + 1], std::size_t pos) {
    std::size_t suffixlen = size - pos;
    
    for (std::size_t i = 0; i < suffixlen; i++) {
      if (needle[i] != needle[pos + i])
        return false;
    }
    return true;
  }